

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

SourceLocation inja::get_source_location(string_view content,size_t pos)

{
  SourceLocation SVar1;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  size_t in_R8;
  string_view view;
  ulong local_68;
  size_t search_start;
  size_t count_lines;
  size_t last_newline;
  undefined1 local_40 [8];
  string_view sliced;
  size_t pos_local;
  string_view content_local;
  size_t local_10;
  
  view._M_len = content._M_str;
  view._M_str = (char *)0x0;
  sliced._M_str = (char *)pos;
  _local_40 = string_view::slice((string_view *)content._M_len,view,pos,in_R8);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_40,'\n',
                     0xffffffffffffffff);
  if (sVar2 == 0xffffffffffffffff) {
    content_local._M_str = (char *)0x1;
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_40);
    local_10 = sVar3 + 1;
  }
  else {
    search_start = 0;
    local_68 = 0;
    while (sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                             ((basic_string_view<char,_std::char_traits<char>_> *)local_40),
          local_68 <= sVar3) {
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_40,'\n',local_68)
      ;
      local_68 = sVar4 + 1;
      if (local_68 == 0) break;
      search_start = search_start + 1;
    }
    content_local._M_str = (char *)(search_start + 1);
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_40);
    local_10 = sVar3 - sVar2;
  }
  SVar1.column = local_10;
  SVar1.line = (size_t)content_local._M_str;
  return SVar1;
}

Assistant:

inline SourceLocation get_source_location(std::string_view content, size_t pos) {
  // Get line and offset position (starts at 1:1)
  auto sliced = string_view::slice(content, 0, pos);
  const std::size_t last_newline = sliced.rfind('\n');

  if (last_newline == std::string_view::npos) {
    return {1, sliced.length() + 1};
  }

  // Count newlines
  size_t count_lines = 0;
  size_t search_start = 0;
  while (search_start <= sliced.size()) {
    search_start = sliced.find('\n', search_start) + 1;
    if (search_start == 0) {
      break;
    }
    count_lines += 1;
  }

  return {count_lines + 1, sliced.length() - last_newline};
}